

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O1

SquareMatrix<double> __thiscall
qclab::dense::operator*(dense *this,SquareMatrix<double> *lhs,SquareMatrix<double> *rhs)

{
  long lVar1;
  long lVar2;
  double *pdVar3;
  double *__s;
  double *pdVar4;
  data_type extraout_RDX;
  long lVar5;
  double *pdVar6;
  long lVar7;
  double *pdVar8;
  int64_t k;
  long lVar9;
  ulong __n;
  double dVar10;
  SquareMatrix<double> SVar11;
  
  lVar1 = lhs->size_;
  lVar2 = rhs->size_;
  if (lVar1 != lVar2) {
    __assert_fail("size_ == rhs.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/include/qclab/dense/SquareMatrix.hpp"
                  ,0xb0,
                  "SquareMatrix<T> &qclab::dense::SquareMatrix<double>::operator*=(const SquareMatrix<T> &) [T = double]"
                 );
  }
  if (lVar1 != 0) {
    __n = -(ulong)((ulong)(lVar1 * lVar1) >> 0x3d != 0) | lVar1 * lVar1 * 8;
    __s = (double *)operator_new__(__n);
    memset(__s,0,__n);
    if (0 < lVar1) {
      pdVar3 = (lhs->data_)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
               super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
               super__Head_base<0UL,_double_*,_false>._M_head_impl;
      pdVar4 = (rhs->data_)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
               super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
               super__Head_base<0UL,_double_*,_false>._M_head_impl;
      lVar5 = 0;
      do {
        lVar7 = 0;
        pdVar6 = pdVar3;
        do {
          dVar10 = __s[lVar5 * lVar1 + lVar7];
          lVar9 = 0;
          pdVar8 = pdVar6;
          do {
            dVar10 = dVar10 + *pdVar8 * pdVar4[lVar9];
            __s[lVar5 * lVar1 + lVar7] = dVar10;
            lVar9 = lVar9 + 1;
            pdVar8 = pdVar8 + lVar1;
          } while (lVar1 != lVar9);
          lVar7 = lVar7 + 1;
          pdVar6 = pdVar6 + 1;
        } while (lVar7 != lVar1);
        lVar5 = lVar5 + 1;
        pdVar4 = pdVar4 + lVar2;
      } while (lVar5 != lVar1);
    }
    pdVar3 = (lhs->data_)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
             super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
             super__Head_base<0UL,_double_*,_false>._M_head_impl;
    (lhs->data_)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
    super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
    super__Head_base<0UL,_double_*,_false>._M_head_impl = __s;
    if (pdVar3 != (double *)0x0) {
      operator_delete__(pdVar3);
    }
    SquareMatrix<double>::SquareMatrix((SquareMatrix<double> *)this,lhs);
    SVar11.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
    super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
    super__Head_base<0UL,_double_*,_false>._M_head_impl =
         extraout_RDX._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
         super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
         super__Head_base<0UL,_double_*,_false>._M_head_impl;
    SVar11.size_ = (size_type_conflict)this;
    return SVar11;
  }
  __assert_fail("size > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/include/qclab/dense/memory.hpp"
                ,0x1e,"auto qclab::dense::init_unique_array(const int64_t) [T = double]");
}

Assistant:

inline SquareMatrix< T >& operator*=( const SquareMatrix< T >& rhs ) {
          assert( size_ == rhs.size() ) ;
          auto new_data = init_unique_array< T >( size_ * size_ ) ;
          #pragma omp parallel for
          for ( int64_t j = 0; j < size_; j++ ) {
            for ( int64_t i = 0; i < size_; i++ ) {
              for ( int64_t k = 0; k < size_; k++ ) {
                new_data.get()[ i + j*size_ ] += (*this)(i,k) * rhs(k,j) ;
              }
            }
          }
          data_ = std::move( new_data ) ;
          return *this ;
        }